

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O1

uint32_t __thiscall basist::bitwise_decoder::get_bits(bitwise_decoder *this,uint32_t num_bits)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  bool bVar8;
  
  if (num_bits < 0x1a) {
    if (num_bits == 0) {
      uVar1 = 0;
LAB_0013bc56:
      this->m_bit_buf = this->m_bit_buf >> ((byte)num_bits & 0x1f);
      goto LAB_0013bc6b;
    }
    uVar1 = this->m_bit_buf_size;
    uVar6 = this->m_bit_buf;
    pbVar3 = this->m_pBuf;
    do {
      if (num_bits <= uVar1) {
        uVar1 = ~(-1 << ((byte)num_bits & 0x1f)) & this->m_bit_buf;
        goto LAB_0013bc56;
      }
      uVar2 = 0;
      pbVar4 = pbVar3;
      if (pbVar3 < this->m_pBuf_end) {
        pbVar4 = pbVar3 + 1;
        this->m_pBuf = pbVar4;
        uVar2 = (uint)*pbVar3;
      }
      uVar6 = uVar6 | uVar2 << ((byte)uVar1 & 0x1f);
      this->m_bit_buf = uVar6;
      uVar1 = uVar1 + 8;
      this->m_bit_buf_size = uVar1;
      pbVar3 = pbVar4;
    } while (uVar1 < 0x21);
  }
  else {
    if (0x20 < num_bits) {
      __assert_fail("num_bits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                    ,0x160,"uint32_t basist::bitwise_decoder::get_bits(uint32_t)");
    }
    if (this->m_bit_buf_size < 0x19) {
      uVar1 = this->m_bit_buf;
      pbVar3 = this->m_pBuf;
      uVar2 = this->m_bit_buf_size;
      do {
        uVar5 = 0;
        pbVar4 = pbVar3;
        if (pbVar3 < this->m_pBuf_end) {
          pbVar4 = pbVar3 + 1;
          this->m_pBuf = pbVar4;
          uVar5 = (uint)*pbVar3;
        }
        uVar1 = uVar1 | uVar5 << ((byte)uVar2 & 0x1f);
        this->m_bit_buf = uVar1;
        this->m_bit_buf_size = uVar2 + 8;
        bVar8 = uVar2 < 0x11;
        pbVar3 = pbVar4;
        uVar2 = uVar2 + 8;
      } while (bVar8);
    }
    uVar2 = this->m_bit_buf;
    uVar5 = uVar2 >> 0x19;
    this->m_bit_buf = uVar5;
    uVar1 = this->m_bit_buf_size - 0x19;
    this->m_bit_buf_size = uVar1;
    num_bits = num_bits - 0x19;
    if (num_bits == 0) {
      uVar1 = 0;
LAB_0013bc5f:
      this->m_bit_buf = this->m_bit_buf >> ((byte)num_bits & 0x1f);
      uVar1 = uVar2 & 0x1ffffff | uVar1;
LAB_0013bc6b:
      this->m_bit_buf_size = this->m_bit_buf_size - num_bits;
      return uVar1;
    }
    if (0x19 < num_bits) {
      __assert_fail("num_bits <= 25",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                    ,0x144,"uint32_t basist::bitwise_decoder::peek_bits(uint32_t)");
    }
    pbVar3 = this->m_pBuf;
    do {
      if (num_bits <= uVar1) {
        uVar1 = (~(-1 << ((byte)num_bits & 0x1f)) & this->m_bit_buf) << 0x19;
        goto LAB_0013bc5f;
      }
      uVar7 = 0;
      pbVar4 = pbVar3;
      if (pbVar3 < this->m_pBuf_end) {
        pbVar4 = pbVar3 + 1;
        this->m_pBuf = pbVar4;
        uVar7 = (uint)*pbVar3;
      }
      uVar5 = uVar5 | uVar7 << ((byte)uVar1 & 0x1f);
      this->m_bit_buf = uVar5;
      uVar1 = uVar1 + 8;
      this->m_bit_buf_size = uVar1;
      pbVar3 = pbVar4;
    } while (uVar1 < 0x21);
  }
  __assert_fail("m_bit_buf_size <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                ,0x14e,"uint32_t basist::bitwise_decoder::peek_bits(uint32_t)");
}

Assistant:

uint32_t get_bits(uint32_t num_bits)
		{
			if (num_bits > 25)
			{
				assert(num_bits <= 32);

				const uint32_t bits0 = peek_bits(25);
				m_bit_buf >>= 25;
				m_bit_buf_size -= 25;
				num_bits -= 25;

				const uint32_t bits = peek_bits(num_bits);
				m_bit_buf >>= num_bits;
				m_bit_buf_size -= num_bits;

				return bits0 | (bits << 25);
			}

			const uint32_t bits = peek_bits(num_bits);

			m_bit_buf >>= num_bits;
			m_bit_buf_size -= num_bits;

			return bits;
		}